

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileDescriptor.cpp
# Opt level: O0

off_t __thiscall Liby::FileDescriptor::getFileSize(FileDescriptor *this)

{
  int iVar1;
  undefined1 local_a0 [4];
  int ret;
  stat st;
  FileDescriptor *this_local;
  
  st.__glibc_reserved[2] = (__syscall_slong_t)this;
  iVar1 = fd(this);
  if (-1 < iVar1) {
    iVar1 = fd(this);
    iVar1 = fstat(iVar1,(stat *)local_a0);
    if (iVar1 < 0) {
      throw_err();
    }
    return st.st_rdev;
  }
  __assert_fail("fd() >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/FileDescriptor.cpp"
                ,0x20,"off_t Liby::FileDescriptor::getFileSize()");
}

Assistant:

off_t FileDescriptor::getFileSize() {
    assert(fd() >= 0);

    struct stat st;
    int ret = ::fstat(fd(), &st);
    if (ret < 0) {
        throw_err();
    }
    return st.st_size;
}